

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

ssize_t Omega_h::gmsh::read(int __fd,void *__buf,size_t __nbytes)

{
  ClassSets *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Real RVar3;
  pointer pVVar4;
  bool bVar5;
  I32 IVar6;
  uint uVar7;
  Omega_h_Family OVar8;
  int iVar9;
  int iVar10;
  Library *library_in;
  istream *this;
  istream *piVar11;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  ulong uVar15;
  undefined8 uVar16;
  pointer pVVar17;
  Write<int> *__n;
  void *__buf_00;
  void *__buf_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  vector<int,_std::allocator<int>_> *this_00;
  Int j;
  char *pcVar19;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  Int *value;
  undefined4 in_register_0000003c;
  ulong uVar20;
  Int j_1;
  ulong uVar21;
  Write<int> *pWVar22;
  long lVar23;
  uint ent_dim;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  int block_node;
  uint uVar25;
  long lVar26;
  long *plVar27;
  int block_node_1;
  int iVar28;
  _Alloc_hider _Var29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  LO size_in;
  bool bVar31;
  initializer_list<std::pair<int,_int>_> __l;
  ulong uStack_360;
  Omega_h_Family local_344;
  int nnodes;
  Int physical;
  void *local_328;
  Int tag_1;
  Mesh *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  Int num_volumes;
  void *local_2f8;
  allocator local_2e9;
  Real format;
  Int num_bounding_points;
  Int num_physicals_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> node_coords;
  HostWrite<double> host_coords;
  I32 elementary;
  Int data_size;
  Int file_type;
  I32 ignored;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  physical_names;
  Write<int> local_228;
  int one;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [13];
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_nodes;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_class_ids;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> node_number_map;
  Write<int> local_40;
  
  library_in = Comm::library(*(Comm **)__nbytes);
  local_310 = (Mesh *)CONCAT44(in_register_0000003c,__fd);
  Omega_h::Mesh::Mesh((Mesh *)CONCAT44(in_register_0000003c,__fd),library_in);
  IVar6 = Comm::rank(*(Comm **)__nbytes);
  if (IVar6 != 0) goto LAB_0029bdc3;
  std::__cxx11::string::string((string *)&one,"$MeshFormat",(allocator *)&ent_class_ids);
  anon_unknown_0::seek_line((istream *)__buf,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  this = std::istream::_M_extract<double>((double *)__buf);
  piVar11 = (istream *)std::istream::operator>>((istream *)this,&file_type);
  std::istream::operator>>(piVar11,&data_size);
  if (1 < (uint)file_type) {
    uVar16 = 0xdd;
    pcVar19 = "file_type == 0 || file_type == 1";
LAB_0029bf69:
    fail("assertion %s failed at %s +%d\n",pcVar19,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,uVar16);
  }
  if (file_type == 1) {
    anon_unknown_0::eat_newlines((istream *)__buf);
    binary::read_value<int>((istream *)__buf,&one,false);
    bVar31 = one != 1;
    if (bVar31) {
      binary::swap_bytes<int>(&one);
      if (one != 1) {
        uVar16 = 0xe7;
        pcVar19 = "one == 1";
        goto LAB_0029bf69;
      }
    }
  }
  else {
    bVar31 = false;
  }
  if (data_size != 8) {
    uVar16 = 0xea;
    pcVar19 = "data_size == sizeof(Real)";
    goto LAB_0029bf69;
  }
  physical_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  physical_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  physical_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&one,"$PhysicalNames",(allocator *)&ent_class_ids);
  bVar5 = anon_unknown_0::seek_optional_section((istream *)__buf,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  if (bVar5) {
    anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_nodes,file_type == 1,bVar31);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&physical_names,
              (long)(int)ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start);
    anon_unknown_0::eat_newlines((istream *)__buf);
    iVar10 = 0;
    while (iVar10 < (int)ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start) {
      anon_unknown_0::read<int>((istream *)__buf,(int *)&node_number_map,file_type == 1,bVar31);
      anon_unknown_0::read<int>((istream *)__buf,(int *)&host_coords,file_type == 1,bVar31);
      iVar9 = (int)host_coords.write_.shared_alloc_.alloc;
      if ((int)host_coords.write_.shared_alloc_.alloc != iVar10 + 1) {
        fail("assertion %s failed at %s +%d\n","number == i + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0xf5);
      }
      _one = (pointer)local_208;
      local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_208[0]._M_local_buf[0] = '\0';
      std::operator>>((istream *)__buf,(string *)&one);
      std::__cxx11::string::substr((ulong)&ent_class_ids,(ulong)&one);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &physical_names,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ent_class_ids
                );
      std::__cxx11::string::~string((string *)&ent_class_ids);
      std::__cxx11::string::~string((string *)&one);
      iVar10 = iVar9;
    }
  }
  std::__cxx11::string::string((string *)&one,"$Entities",(allocator *)&ent_class_ids);
  bVar5 = anon_unknown_0::seek_optional_section((istream *)__buf,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  RVar3 = format;
  if (bVar5) {
    anon_unknown_0::read<int>((istream *)__buf,(int *)&node_number_map,file_type == 1,bVar31);
    anon_unknown_0::read<int>((istream *)__buf,(int *)&host_coords,file_type == 1,bVar31);
    anon_unknown_0::read<int>((istream *)__buf,(int *)&node_coords,file_type == 1,bVar31);
    anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
    pCVar1 = &local_310->class_sets;
    while (0 < (int)node_number_map._M_t._M_impl._0_4_) {
      node_number_map._M_t._M_impl._0_4_ = node_number_map._M_t._M_impl._0_4_ + -1;
      anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_class_ids,file_type == 1,bVar31);
      anon_unknown_0::read<double>((istream *)__buf,(double *)&one,file_type == 1,bVar31);
      anon_unknown_0::read<double>((istream *)__buf,(double *)&local_210,file_type == 1,bVar31);
      anon_unknown_0::read<double>
                ((istream *)__buf,(double *)&local_208[0]._M_allocated_capacity,file_type == 1,
                 bVar31);
      if ((RVar3 == 4.0) && (!NAN(RVar3))) {
        anon_unknown_0::read<double>((istream *)__buf,(double *)&one,file_type == 1,bVar31);
        anon_unknown_0::read<double>((istream *)__buf,(double *)&local_210,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,(double *)&local_208[0]._M_allocated_capacity,file_type == 1,
                   bVar31);
      }
      anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_nodes,file_type == 1,bVar31);
      while( true ) {
        iVar10 = (int)ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)ent_nodes._M_elems[0].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + -1);
        if (iVar10 < 1) break;
        anon_unknown_0::read<int>((istream *)__buf,&physical,file_type == 1,bVar31);
        if ((ulong)(uint)physical == 0) {
          fail("assertion %s failed at %s +%d\n","physical != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0xac);
        }
        if (0 < physical) {
          pvVar12 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                    ::operator[](pCVar1,physical_names.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                        ((ulong)(uint)physical - 1));
          tag_1 = 0;
          std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::emplace_back<int,int&>
                    (pvVar12,&tag_1,(int *)&ent_class_ids);
        }
      }
    }
    ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(2,(int)host_coords.write_.shared_alloc_.alloc);
    ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(2,(int)node_coords.
                                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(3,num_volumes);
    __l._M_len = 3;
    __l._M_array = (iterator)&ent_class_ids;
    node_number_map._M_t._M_impl._0_4_ = node_number_map._M_t._M_impl._0_4_ + -1;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&one,__l,
               (allocator_type *)&ent_nodes);
    local_2c0 = local_210;
    _Var29._M_p = _one;
    while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var29._M_p != local_2c0) {
      iVar10 = *(int *)_Var29._M_p;
      physical = *(Int *)(_Var29._M_p + 4);
      local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var29._M_p;
      while (0 < iVar10) {
        anon_unknown_0::read<int>((istream *)__buf,&tag_1,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,(double *)&ent_class_ids,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,
                   (double *)
                   &ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,
                   (double *)
                   &ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,file_type == 1,bVar31);
        anon_unknown_0::read<double>((istream *)__buf,(double *)&ent_nodes,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,
                   (double *)
                   &ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,file_type == 1,bVar31);
        anon_unknown_0::read<double>
                  ((istream *)__buf,
                   (double *)
                   &ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,&num_physicals_2,file_type == 1,bVar31);
        iVar10 = iVar10 + -1;
        while (0 < num_physicals_2) {
          num_physicals_2 = num_physicals_2 + -1;
          anon_unknown_0::read<int>((istream *)__buf,&num_bounding_points,file_type == 1,bVar31);
          if ((ulong)(uint)num_bounding_points == 0) {
            fail("assertion %s failed at %s +%d\n","physical != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,199);
          }
          if (0 < num_bounding_points) {
            pvVar12 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                      ::operator[](pCVar1,physical_names.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)(uint)num_bounding_points - 1));
            std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
            emplace_back<int_const&,int&>(pvVar12,&physical,&tag_1);
          }
        }
        num_physicals_2 = num_physicals_2 + -1;
        anon_unknown_0::read<int>((istream *)__buf,&num_bounding_points,file_type == 1,bVar31);
        while (iVar9 = num_bounding_points + -1, bVar5 = 0 < num_bounding_points,
              num_bounding_points = iVar9, bVar5) {
          anon_unknown_0::read<int>((istream *)__buf,&elementary,file_type == 1,bVar31);
        }
      }
      _Var29._M_p = (pointer)(&local_308->_M_allocated_capacity + 1);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&one);
    _one = (pointer)local_208;
    local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_208[0]._M_local_buf[0] = '\0';
    __it._M_current = (char *)&one;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)__buf,(string *)__it._M_current);
    if (local_210 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(_one + (long)local_210);
      paVar24 = local_210;
      _Var29._M_p = _one;
      for (lVar26 = (long)local_210 >> 2;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var29._M_p, paVar30 = paVar2, 0 < lVar26; lVar26 = lVar26 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              *)_Var29._M_p,__it);
        if (bVar5) goto LAB_0029ad74;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(_Var29._M_p + 1))->_M_local_buf,__it);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(_Var29._M_p + 1);
        if (bVar5) goto LAB_0029ad74;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(_Var29._M_p + 2))->_M_local_buf,__it);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(_Var29._M_p + 2);
        if (bVar5) goto LAB_0029ad74;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(_Var29._M_p + 3))->_M_local_buf,__it);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(_Var29._M_p + 3);
        if (bVar5) goto LAB_0029ad74;
        _Var29._M_p = _Var29._M_p + 4;
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar24->_M_allocated_capacity + -1) + 4);
      }
      if (paVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x1) {
LAB_0029ad57:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                              *)_Var29._M_p,__it);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var29._M_p;
        if (!bVar5) {
          paVar18 = paVar2;
        }
LAB_0029ad74:
        paVar24 = paVar18;
        if (paVar18 != paVar2) {
          while (paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(paVar24->_M_local_buf + 1), paVar30 = paVar18, paVar24 != paVar2) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                    ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                                  *)paVar24->_M_local_buf,__it);
            if (!bVar5) {
              paVar18->_M_local_buf[0] = paVar24->_M_local_buf[0];
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar18->_M_local_buf + 1);
            }
          }
        }
      }
      else {
        if (paVar24 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x2) {
LAB_0029ad48:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                  ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                                *)_Var29._M_p,__it);
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var29._M_p;
          if (!bVar5) {
            _Var29._M_p = _Var29._M_p + 1;
            goto LAB_0029ad57;
          }
          goto LAB_0029ad74;
        }
        if (paVar24 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::$_0>
                  ::operator()((_Iter_pred<Omega_h::gmsh::(anonymous_namespace)::read_internal(std::istream&,Omega_h::Mesh*)::__0>
                                *)_Var29._M_p,__it);
          if (!bVar5) {
            _Var29._M_p = _Var29._M_p + 1;
            goto LAB_0029ad48;
          }
          goto LAB_0029ad74;
        }
      }
      std::__cxx11::string::erase(&one,paVar30);
      if (local_210 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar16 = 0x105;
        pcVar19 = "line.empty()";
        goto LAB_0029bfda;
      }
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)__buf,(string *)&one);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &one,"$EndEntities");
    if (!bVar5) {
      uVar16 = 0x107;
      pcVar19 = "line == \"$EndEntities\"";
LAB_0029bfda:
      fail("assertion %s failed at %s +%d\n",pcVar19,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,uVar16);
    }
    std::__cxx11::string::~string((string *)&one);
  }
  std::__cxx11::string::string((string *)&one,"$Nodes",(allocator *)&ent_class_ids);
  anon_unknown_0::seek_line((istream *)__buf,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  node_coords.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  node_coords.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  node_coords.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_number_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_number_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_number_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_number_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_number_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  node_number_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_number_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (4.0 <= format) {
    anon_unknown_0::eat_newlines((istream *)__buf);
    anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_class_ids,file_type == 1,bVar31);
    anon_unknown_0::read<int>((istream *)__buf,&nnodes,file_type == 1,bVar31);
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&node_coords,(long)nnodes);
    if (4.1 <= format) {
      anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_nodes,file_type == 1,bVar31);
      anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_nodes,file_type == 1,bVar31);
      for (iVar10 = 0;
          iVar10 < (int)ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start; iVar10 = iVar10 + 1) {
        anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,(int *)&host_coords,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,&physical,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,&tag_1,file_type == 1,bVar31);
        for (iVar9 = 0; iVar9 < tag_1; iVar9 = iVar9 + 1) {
          anon_unknown_0::read<int>((istream *)__buf,&one,file_type == 1,bVar31);
          pVVar4 = node_coords.
                   super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pVVar17 = node_coords.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&node_number_map,(key_type *)&one);
          *pmVar13 = (int)(((long)pVVar4 - (long)pVVar17) / 0x18) + iVar9;
        }
        for (iVar9 = 0; iVar9 < tag_1; iVar9 = iVar9 + 1) {
          anon_unknown_0::read<double>((istream *)__buf,(double *)&one,file_type == 1,bVar31);
          anon_unknown_0::read<double>((istream *)__buf,(double *)&local_210,file_type == 1,bVar31);
          anon_unknown_0::read<double>
                    ((istream *)__buf,(double *)&local_208[0]._M_allocated_capacity,file_type == 1,
                     bVar31);
          std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                    (&node_coords,(value_type *)&one);
        }
      }
    }
    else {
      iVar10 = 0;
      while (iVar10 < (int)ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) {
        anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_nodes,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,(int *)&host_coords,file_type == 1,bVar31);
        local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_308._4_4_,iVar10);
        anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
        anon_unknown_0::read<int>((istream *)__buf,&physical,file_type == 1,bVar31);
        for (iVar10 = 0; iVar10 < physical; iVar10 = iVar10 + 1) {
          anon_unknown_0::read<int>((istream *)__buf,&tag_1,file_type == 1,bVar31);
          pVVar4 = node_coords.
                   super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pVVar17 = node_coords.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&node_number_map,&tag_1);
          *pmVar13 = (mapped_type)(((long)pVVar4 - (long)pVVar17) / 0x18);
          anon_unknown_0::read<double>((istream *)__buf,(double *)&one,file_type == 1,bVar31);
          anon_unknown_0::read<double>((istream *)__buf,(double *)&local_210,file_type == 1,bVar31);
          anon_unknown_0::read<double>
                    ((istream *)__buf,(double *)&local_208[0]._M_allocated_capacity,file_type == 1,
                     bVar31);
          std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                    (&node_coords,(value_type *)&one);
        }
        iVar10 = (int)local_308 + 1;
      }
    }
  }
  else {
    std::istream::operator>>((istream *)__buf,&nnodes);
    if ((long)nnodes < 0) {
      fail("assertion %s failed at %s +%d\n","nnodes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,0x145);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&node_coords,(long)nnodes);
    anon_unknown_0::eat_newlines((istream *)__buf);
    iVar10 = 0;
    while (iVar10 < nnodes) {
      anon_unknown_0::read<int>((istream *)__buf,(int *)&ent_class_ids,file_type == 1,bVar31);
      iVar9 = (int)ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if ((int)ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != iVar10 + 1) {
        fail("assertion %s failed at %s +%d\n","number == i + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x14e);
      }
      anon_unknown_0::read<double>((istream *)__buf,(double *)&one,file_type == 1,bVar31);
      anon_unknown_0::read<double>((istream *)__buf,(double *)&local_210,file_type == 1,bVar31);
      anon_unknown_0::read<double>
                ((istream *)__buf,(double *)&local_208[0]._M_allocated_capacity,file_type == 1,
                 bVar31);
      std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::push_back
                (&node_coords,(value_type *)&one);
      iVar10 = iVar9;
    }
  }
  std::__cxx11::string::string((string *)&one,"$Elements",(allocator *)&ent_class_ids);
  anon_unknown_0::seek_line((istream *)__buf,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  ent_class_ids._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_class_ids._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_class_ids._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_class_ids._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_class_ids._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_class_ids._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_class_ids._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_class_ids._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_class_ids._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_class_ids._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_nodes._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_nodes._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_nodes._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_nodes._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ent_nodes._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ent_nodes._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ent_nodes._M_elems[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (4.0 <= format) {
    anon_unknown_0::eat_newlines((istream *)__buf);
    anon_unknown_0::read<int>((istream *)__buf,&one,file_type == 1,bVar31);
    anon_unknown_0::read<int>((istream *)__buf,(int *)&host_coords,file_type == 1,bVar31);
    if (4.1 <= format) {
      anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
      anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
    }
    local_344 = OMEGA_H_SIMPLEX;
    for (iVar10 = 0; iVar10 < one; iVar10 = iVar10 + 1) {
      if ((format != 4.0) || (NAN(format))) {
        anon_unknown_0::read<int>((istream *)__buf,&physical,file_type == 1,bVar31);
        value = &num_volumes;
      }
      else {
        anon_unknown_0::read<int>((istream *)__buf,&num_volumes,file_type == 1,bVar31);
        value = &physical;
      }
      anon_unknown_0::read<int>((istream *)__buf,value,file_type == 1,bVar31);
      anon_unknown_0::read<int>((istream *)__buf,&tag_1,file_type == 1,bVar31);
      anon_unknown_0::read<int>((istream *)__buf,&num_physicals_2,file_type == 1,bVar31);
      uVar7 = anon_unknown_0::type_dim(tag_1);
      if (uVar7 != physical) {
        fail("assertion %s failed at %s +%d\n","dim == class_dim",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x172);
      }
      OVar8 = anon_unknown_0::type_family(tag_1);
      if (OVar8 != OMEGA_H_SIMPLEX) {
        local_344 = OMEGA_H_HYPERCUBE;
      }
      uVar15 = (ulong)uVar7;
      if (local_344 == OMEGA_H_SIMPLEX) {
        iVar9 = uVar7 + 1;
      }
      else {
        iVar9 = *(int *)(&DAT_0037807c + uVar15 * 4);
      }
      local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_308._4_4_,iVar9);
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ent_class_ids._M_elems + uVar15);
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)local_2c0,
                 (long)num_physicals_2 +
                 ((long)((long)ent_class_ids._M_elems[uVar15].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - local_2c0->_M_allocated_capacity)
                 >> 2));
      this_00 = ent_nodes._M_elems + uVar15;
      std::vector<int,_std::allocator<int>_>::reserve
                (this_00,(long)(int)local_308 * (long)num_physicals_2 +
                         ((long)ent_nodes._M_elems[uVar15].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start >> 2));
      for (iVar9 = 0; iVar9 < num_physicals_2; iVar9 = iVar9 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_2c0,&num_volumes);
        anon_unknown_0::read<int>((istream *)__buf,&num_bounding_points,file_type == 1,bVar31);
        iVar28 = (int)local_308;
        while (bVar5 = iVar28 != 0, iVar28 = iVar28 + -1, bVar5) {
          anon_unknown_0::read<int>((istream *)__buf,&elementary,file_type == 1,bVar31);
          iVar14 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&node_number_map._M_t,&elementary);
          if ((_Rb_tree_header *)iVar14._M_node ==
              &node_number_map._M_t._M_impl.super__Rb_tree_header) {
            fail("assertion %s failed at %s +%d\n","it != node_number_map.end()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0x183);
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    (this_00,(value_type_conflict1 *)&iVar14._M_node[1].field_0x4);
        }
      }
    }
  }
  else {
    std::istream::operator>>((istream *)__buf,&num_volumes);
    if (num_volumes < 0) {
      fail("assertion %s failed at %s +%d\n","nents >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,0x18c);
    }
    std::
    array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
    ::array((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
             *)&one);
    if (file_type == 1) {
      anon_unknown_0::eat_newlines((istream *)__buf);
      iVar10 = 0;
      local_344 = OMEGA_H_SIMPLEX;
      while (iVar10 < num_volumes) {
        binary::read_value<int>((istream *)__buf,(int *)&host_coords,bVar31);
        binary::read_value<int>((istream *)__buf,&physical,bVar31);
        binary::read_value<int>((istream *)__buf,&tag_1,bVar31);
        uVar7 = anon_unknown_0::type_dim((int)host_coords.write_.shared_alloc_.alloc);
        OVar8 = anon_unknown_0::type_family((int)host_coords.write_.shared_alloc_.alloc);
        if (OVar8 != OMEGA_H_SIMPLEX) {
          local_344 = OMEGA_H_HYPERCUBE;
        }
        uVar15 = (ulong)uVar7;
        if (local_344 == OMEGA_H_SIMPLEX) {
          iVar9 = uVar7 + 1;
        }
        else {
          iVar9 = *(int *)(&DAT_0037807c + uVar15 * 4);
        }
        local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_2c0._4_4_,iVar9);
        if (tag_1 < 2) {
          fail("assertion %s failed at %s +%d\n","ntags >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x19b);
        }
        local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ent_class_ids._M_elems + uVar15);
        for (iVar9 = 0; iVar9 < physical; iVar9 = iVar9 + 1) {
          binary::read_value<int>((istream *)__buf,&num_physicals_2,bVar31);
          binary::read_value<int>((istream *)__buf,&num_bounding_points,bVar31);
          binary::read_value<int>((istream *)__buf,&elementary,bVar31);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_308,&elementary);
          if (num_bounding_points != 0) {
            std::
            _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<int&,int&>
                      ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)(&one + uVar15 * 0xe),&elementary,&num_bounding_points);
          }
          for (iVar28 = 2; iVar28 < tag_1; iVar28 = iVar28 + 1) {
            binary::read_value<int>((istream *)__buf,&ignored,false);
          }
          iVar28 = (int)local_2c0;
          while (bVar5 = iVar28 != 0, iVar28 = iVar28 + -1, bVar5) {
            binary::read_value<int>((istream *)__buf,&ignored,bVar31);
            local_228.shared_alloc_.alloc._0_4_ = ignored + -1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (ent_nodes._M_elems + uVar15,(int *)&local_228);
          }
          iVar10 = iVar10 + 1;
        }
      }
    }
    else {
      local_344 = OMEGA_H_SIMPLEX;
      for (iVar10 = 0; iVar10 < num_volumes; iVar10 = iVar10 + 1) {
        std::istream::operator>>((istream *)__buf,(int *)&host_coords);
        if ((int)host_coords.write_.shared_alloc_.alloc < 1) {
          fail("assertion %s failed at %s +%d\n","number > 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x1b4);
        }
        std::istream::operator>>((istream *)__buf,&physical);
        uVar7 = anon_unknown_0::type_dim(physical);
        OVar8 = anon_unknown_0::type_family(physical);
        if (OVar8 != OMEGA_H_SIMPLEX) {
          local_344 = OMEGA_H_HYPERCUBE;
        }
        std::istream::operator>>((istream *)__buf,&tag_1);
        if (tag_1 < 2) {
          fail("assertion %s failed at %s +%d\n","ntags >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x1bb);
        }
        piVar11 = (istream *)std::istream::operator>>((istream *)__buf,&num_physicals_2);
        std::istream::operator>>(piVar11,&num_bounding_points);
        uVar15 = (ulong)uVar7;
        std::vector<int,_std::allocator<int>_>::push_back
                  (ent_class_ids._M_elems + uVar15,&num_bounding_points);
        if (num_physicals_2 != 0) {
          std::
          _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<int&,int&>
                    ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(&one + uVar15 * 0xe),&num_bounding_points,&num_physicals_2);
        }
        for (iVar9 = 2; iVar9 < tag_1; iVar9 = iVar9 + 1) {
          std::istream::operator>>((istream *)__buf,&elementary);
        }
        iVar9 = uVar7 + 1;
        while (bVar31 = iVar9 != 0, iVar9 = iVar9 + -1, bVar31) {
          std::istream::operator>>((istream *)__buf,&ignored);
          local_228.shared_alloc_.alloc._0_4_ = ignored + -1;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (ent_nodes._M_elems + uVar15,(int *)&local_228);
        }
      }
    }
    pCVar1 = &local_310->class_sets;
    for (physical = 0; physical < 4; physical = physical + 1) {
      plVar27 = (long *)((long)local_208 + (long)physical * 0x38);
      while (plVar27 = (long *)*plVar27, plVar27 != (long *)0x0) {
        tag_1 = *(Int *)(plVar27 + 1);
        iVar10 = *(int *)((long)plVar27 + 0xc);
        std::__cxx11::to_string((string *)&host_coords,iVar10);
        if (iVar10 <= (int)((ulong)((long)physical_names.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)physical_names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
          std::__cxx11::string::_M_assign((string *)&host_coords);
        }
        pvVar12 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                  ::operator[](pCVar1,(string *)&host_coords);
        std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
        emplace_back<int&,int_const&>(pvVar12,&physical,&tag_1);
        std::__cxx11::string::~string((string *)&host_coords);
      }
    }
    std::
    array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
    ::~array((array<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_4UL>
              *)&one);
  }
  iVar10 = nnodes;
  uStack_360 = 1;
  if (ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      ent_nodes._M_elems[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (ent_nodes._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        ent_nodes._M_elems[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (ent_nodes._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          ent_nodes._M_elems[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        fail("There were no Elements of dimension higher than zero!\n");
      }
    }
    else {
      uStack_360 = 2;
    }
  }
  else {
    uStack_360 = 3;
  }
  std::__cxx11::string::string((string *)&one,"",(allocator *)&num_volumes);
  uVar7 = (uint)uStack_360;
  HostWrite<double>::HostWrite(&host_coords,iVar10 * uVar7,(string *)&one);
  std::__cxx11::string::~string((string *)&one);
  uVar20 = 0;
  uVar15 = (ulong)(uint)nnodes;
  if (nnodes < 1) {
    uVar15 = uVar20;
  }
  pVVar17 = node_coords.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (; uVar20 != uVar15; uVar20 = uVar20 + 1) {
    for (uVar21 = 0; uStack_360 != uVar21; uVar21 = uVar21 + 1) {
      *(double *)((long)host_coords.write_.shared_alloc_.direct_ptr + uVar21 * 8) =
           (pVVar17->super_Few<double,_3>).array_[uVar21];
    }
    host_coords.write_.shared_alloc_.direct_ptr =
         (void *)((long)host_coords.write_.shared_alloc_.direct_ptr + (ulong)(uVar7 * 8));
    pVVar17 = pVVar17 + 1;
  }
  while (ent_dim = (uint)uStack_360, -1 < (int)ent_dim) {
    if (local_344 == OMEGA_H_SIMPLEX) {
      uVar25 = ent_dim + 1;
      if (3 < ent_dim) {
        uVar25 = 0xffffffff;
      }
    }
    else {
      uVar25 = 0xffffffff;
      if (ent_dim < 4) {
        uVar25 = *(uint *)(&DAT_0037807c + uStack_360 * 4);
      }
    }
    uVar15 = (ulong)((long)ent_nodes._M_elems[uStack_360].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)ent_nodes._M_elems[uStack_360].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar15 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
             (long)(int)uVar25;
    std::__cxx11::string::string((string *)&one,"",(allocator *)&physical);
    size_in = (LO)uVar15;
    HostWrite<int>::HostWrite((HostWrite<int> *)&num_volumes,size_in * uVar25,(string *)&one);
    std::__cxx11::string::~string((string *)&one);
    std::__cxx11::string::string((string *)&one,"",&local_2e9);
    HostWrite<int>::HostWrite((HostWrite<int> *)&physical,size_in,(string *)&one);
    std::__cxx11::string::~string((string *)&one);
    __n = (Write<int> *)0x0;
    if (0 < (int)uVar25) {
      __n = (Write<int> *)(ulong)uVar25;
    }
    uVar15 = uVar15 & 0xffffffff;
    if (size_in < 1) {
      uVar15 = 0;
    }
    lVar26 = 0;
    for (uVar20 = 0; pWVar22 = __n, lVar23 = lVar26, uVar20 != uVar15; uVar20 = uVar20 + 1) {
      while (pWVar22 != (Write<int> *)0x0) {
        *(undefined4 *)((long)local_2f8 + lVar23) =
             *(undefined4 *)
              ((long)ent_nodes._M_elems[uStack_360].super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar23);
        pWVar22 = (Write<int> *)((long)&pWVar22[-1].shared_alloc_.direct_ptr + 7);
        lVar23 = lVar23 + 4;
      }
      *(int *)((long)local_328 + uVar20 * 4) =
           ent_class_ids._M_elems[uStack_360].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar20];
      lVar26 = lVar26 + (long)(int)uVar25 * 4;
    }
    HostWrite<int>::write((HostWrite<int> *)&tag_1,(int)&num_volumes,local_328,(size_t)__n);
    Read<int>::Read((Read<signed_char> *)&one,(Write<int> *)&tag_1);
    Write<int>::~Write((Write<int> *)&tag_1);
    if (ent_dim == uVar7) {
      Write<int>::Write((Write<int> *)&num_physicals_2,(Write<int> *)&one);
      HostWrite<double>::write
                ((HostWrite<double> *)&elementary,(int)&host_coords,__buf_00,(size_t)__n);
      Read<double>::Read((Read<signed_char> *)&num_bounding_points,(Write<double> *)&elementary);
      __n = (Write<int> *)&num_physicals_2;
      build_from_elems_and_coords
                (local_310,local_344,uVar7,(LOs *)&num_physicals_2,(Reals *)&num_bounding_points);
      Write<double>::~Write((Write<double> *)&num_bounding_points);
      Write<double>::~Write((Write<double> *)&elementary);
      Write<int>::~Write((Write<int> *)&num_physicals_2);
    }
    Write<int>::Write((Write<int> *)&ignored,(Write<int> *)&one);
    HostWrite<int>::write((HostWrite<int> *)&local_40,(int)&physical,__buf_01,(size_t)__n);
    Read<int>::Read((Read<signed_char> *)&local_228,&local_40);
    classify_equal_order(local_310,ent_dim,(LOs *)&ignored,(Read<int> *)&local_228);
    Write<int>::~Write(&local_228);
    Write<int>::~Write(&local_40);
    Write<int>::~Write((Write<int> *)&ignored);
    Write<int>::~Write((Write<int> *)&one);
    Write<int>::~Write((Write<int> *)&physical);
    Write<int>::~Write((Write<int> *)&num_volumes);
    uStack_360 = (ulong)(ent_dim - 1);
  }
  finalize_classification(local_310);
  Write<double>::~Write(&host_coords.write_);
  std::array<std::vector<int,_std::allocator<int>_>,_4UL>::~array(&ent_nodes);
  std::array<std::vector<int,_std::allocator<int>_>,_4UL>::~array(&ent_class_ids);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&node_number_map._M_t);
  std::_Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::~_Vector_base
            (&node_coords.
              super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&physical_names);
LAB_0029bdc3:
  Omega_h::Mesh::set_comm(local_310,(CommPtr *)__nbytes);
  Omega_h::Mesh::balance(local_310,false);
  return (ssize_t)local_310;
}

Assistant:

Mesh read(std::istream& stream, CommPtr comm) {
  auto mesh = Mesh(comm->library());
  if (comm->rank() == 0) {
    read_internal(stream, &mesh);
  }
  mesh.set_comm(comm);
  mesh.balance();
  return mesh;
}